

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * httplib::detail::decode_url
                   (string *__return_storage_ptr__,string *s,bool convert_plus_to_space)

{
  ulong i_00;
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  size_t __n;
  size_t i;
  ulong uVar5;
  int val_1;
  int val;
  char buff [4];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar5 = 0;
  do {
    if (s->_M_string_length <= uVar5) {
      return __return_storage_ptr__;
    }
    pcVar2 = (s->_M_dataplus)._M_p;
    cVar1 = pcVar2[uVar5];
    cVar4 = cVar1;
    if (cVar1 == '%') {
      i_00 = uVar5 + 1;
      if (s->_M_string_length <= i_00) goto LAB_00138346;
      if (pcVar2[i_00] == 'u') {
        val = 0;
        bVar3 = from_hex_to_i(s,uVar5 + 2,4,&val);
        if (bVar3) {
          __n = to_utf8(val,buff);
          if (__n != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (__return_storage_ptr__,buff,__n);
          }
          uVar5 = uVar5 + 5;
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (__return_storage_ptr__,(s->_M_dataplus)._M_p[uVar5]);
        }
      }
      else {
        val_1 = 0;
        bVar3 = from_hex_to_i(s,i_00,2,&val_1);
        if (bVar3) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (__return_storage_ptr__,(char)val_1);
          uVar5 = uVar5 + 2;
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (__return_storage_ptr__,(s->_M_dataplus)._M_p[uVar5]);
        }
      }
    }
    else {
      if (convert_plus_to_space) {
        cVar4 = ' ';
      }
      if (cVar1 != '+') {
        cVar4 = cVar1;
      }
LAB_00138346:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,cVar4);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

inline std::string decode_url(const std::string &s,
                              bool convert_plus_to_space) {
  std::string result;

  for (size_t i = 0; i < s.size(); i++) {
    if (s[i] == '%' && i + 1 < s.size()) {
      if (s[i + 1] == 'u') {
        int val = 0;
        if (from_hex_to_i(s, i + 2, 4, val)) {
          // 4 digits Unicode codes
          char buff[4];
          size_t len = to_utf8(val, buff);
          if (len > 0) { result.append(buff, len); }
          i += 5; // 'u0000'
        } else {
          result += s[i];
        }
      } else {
        int val = 0;
        if (from_hex_to_i(s, i + 1, 2, val)) {
          // 2 digits hex codes
          result += static_cast<char>(val);
          i += 2; // '00'
        } else {
          result += s[i];
        }
      }
    } else if (convert_plus_to_space && s[i] == '+') {
      result += ' ';
    } else {
      result += s[i];
    }
  }

  return result;
}